

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

array<unsigned_char,_4UL> string2byte<4u>(string *s,int base,char sep)

{
  array<unsigned_char,_4UL> aVar1;
  const_iterator __first;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__last;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
  splitted;
  array<unsigned_char,_4UL> result;
  char in_stack_00000137;
  string *in_stack_00000138;
  uchar *in_stack_ffffffffffffff28;
  anon_class_8_1_8989b3cf __unary_op;
  int local_98 [37];
  _Type local_4;
  
  __unary_op.base = local_98;
  split<4u>(in_stack_00000138,in_stack_00000137);
  std::begin<std::array<std::__cxx11::string,4ul>>
            ((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
              *)0x137228);
  __first = std::end<std::array<std::__cxx11::string,4ul>>
                      ((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
                        *)0x137239);
  __last = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::begin<std::array<unsigned_char,4ul>>((array<unsigned_char,_4UL> *)0x13724d);
  std::
  transform<std::__cxx11::string_const*,unsigned_char*,string2byte<4u>(std::__cxx11::string_const&,int,char)::_lambda(std::__cxx11::string_const&)_1_>
            (__first,__last,in_stack_ffffffffffffff28,__unary_op);
  std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>::
  ~array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
          *)__unary_op.base);
  aVar1._M_elems[0] = local_4[0];
  aVar1._M_elems[1] = local_4[1];
  aVar1._M_elems[2] = local_4[2];
  aVar1._M_elems[3] = local_4[3];
  return (array<unsigned_char,_4UL>)aVar1._M_elems;
}

Assistant:

std::array<uint8_t, n> string2byte(const std::string& s,
                                   const int base,
                                   const char sep)
{
  const auto splitted = split<n>(s, sep);

  std::array<uint8_t, n> result;

  std::transform(std::begin(splitted),
                 std::end(splitted),
                 std::begin(result),
                 [&base](const std::string& s) -> std::uint8_t
  {
    const auto v = std::stoul(s, nullptr, base);
    if (v > 255)
    {
      throw std::out_of_range("number is larger than 255");
    }
    return static_cast<std::uint8_t>(v);
  });

  return result;
}